

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maths.c
# Opt level: O3

vec3 vec3_orthogonal(vec3 u)

{
  bool bVar1;
  undefined1 auVar2 [16];
  float fVar4;
  undefined1 auVar3 [16];
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  vec3 vVar9;
  
  fVar8 = u.z;
  auVar3._0_8_ = u._0_8_;
  auVar3._8_8_ = u._0_8_;
  fVar7 = SQRT(fVar8 * fVar8 + u.x * u.x + u.y * u.y);
  fVar6 = 0.0;
  fVar5 = 0.0;
  fVar4 = 0.0;
  if ((fVar7 != 0.0) || (NAN(fVar7))) {
    fVar6 = fVar8 / fVar7;
    auVar2._4_4_ = fVar7;
    auVar2._0_4_ = fVar7;
    auVar2._8_4_ = fVar7;
    auVar2._12_4_ = fVar7;
    auVar3 = divps(auVar3,auVar2);
    fVar5 = auVar3._0_4_;
    fVar4 = auVar3._4_4_;
  }
  fVar8 = ABS(fVar4);
  bVar1 = 0.0001 < ABS(fVar5 + -1.0);
  if ((0.0001 >= fVar8 && !bVar1) && 0.0001 >= ABS(fVar6)) {
    fVar5 = 0.0;
    fVar4 = 1.0;
  }
  fVar7 = 0.0;
  if ((0.0001 < fVar8 || bVar1) || 0.0001 < ABS(fVar6)) {
    fVar7 = fVar6;
  }
  vVar9.z = fVar5 * 0.0 - fVar4;
  vVar9.x = fVar4 * 0.0 + fVar7 * -0.0;
  vVar9.y = fVar7 - fVar5 * 0.0;
  return vVar9;
}

Assistant:

vec3 vec3_orthogonal(vec3 u) {
    u = vec3_normalize(u);
    vec3 v = V3(1.0f, 0.0f, 0.0f);
    if (vec3_equal(u, v)) {
        u = V3(0.0f, 1.0f, 0.0f);
    }
    return vec3_cross(u, v);
}